

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

Vector2i __thiscall sf::priv::WindowImplX11::getPosition(WindowImplX11 *this)

{
  bool bVar1;
  Window WVar2;
  undefined1 local_60 [4];
  undefined1 local_5c [4];
  uint depth;
  uint borderWidth;
  uint height;
  uint width;
  int yRelToRoot;
  int xRelToRoot;
  Window root;
  Window ancestor;
  long yFrameExtent;
  long xFrameExtent;
  int yAbsRelToRoot;
  int xAbsRelToRoot;
  Window child;
  WindowImplX11 *this_local;
  
  child = (Window)this;
  XTranslateCoordinates
            (this->m_display,this->m_window,
             *(undefined8 *)
              (*(long *)(this->m_display + 0xe8) + (long)*(int *)(this->m_display + 0xe0) * 0x80 +
              0x10),0,0,(long)&xFrameExtent + 4,&xFrameExtent,&yAbsRelToRoot);
  bVar1 = anon_unknown.dwarf_55d5d::isWMAbsolutePositionGood();
  if (bVar1) {
    Vector2<int>::Vector2((Vector2<int> *)&this_local,xFrameExtent._4_4_,(int)xFrameExtent);
  }
  else {
    bVar1 = anon_unknown.dwarf_55d5d::getEWMHFrameExtents
                      (this->m_display,this->m_window,&yFrameExtent,(long *)&ancestor);
    if (bVar1) {
      Vector2<int>::Vector2
                ((Vector2<int> *)&this_local,xFrameExtent._4_4_ - (int)yFrameExtent,
                 (int)xFrameExtent - (int)ancestor);
    }
    else {
      root = this->m_window;
      _yRelToRoot = *(Window *)
                     (*(long *)(this->m_display + 0xe8) +
                      (long)*(int *)(this->m_display + 0xe0) * 0x80 + 0x10);
      while( true ) {
        WVar2 = anon_unknown.dwarf_55d5d::getParentWindow(this->m_display,root);
        if (WVar2 == _yRelToRoot) break;
        root = anon_unknown.dwarf_55d5d::getParentWindow(this->m_display,root);
      }
      XGetGeometry(this->m_display,root,&yRelToRoot,&width,&height,&borderWidth,&depth,local_5c,
                   local_60);
      Vector2<int>::Vector2((Vector2<int> *)&this_local,width,height);
    }
  }
  return (Vector2i)this_local;
}

Assistant:

Vector2i WindowImplX11::getPosition() const
{
    // Get absolute position of our window relative to root window. This
    // takes into account all information that X11 has, including X11
    // border widths and any decorations. It corresponds to where the
    // window actually is, but not necessarily to where we told it to
    // go using setPosition() and XMoveWindow(). To have the two match
    // as expected, we may have to subtract decorations and borders.
    ::Window child;
    int xAbsRelToRoot, yAbsRelToRoot;

    XTranslateCoordinates(m_display, m_window, DefaultRootWindow(m_display),
        0, 0, &xAbsRelToRoot, &yAbsRelToRoot, &child);

    // CASE 1: some rare WMs actually put the window exactly where we tell
    // it to, even with decorations and such, which get shifted back.
    // In these rare cases, we can use the absolute value directly.
    if (isWMAbsolutePositionGood())
        return Vector2i(xAbsRelToRoot, yAbsRelToRoot);

    // CASE 2: most modern WMs support EWMH and can define _NET_FRAME_EXTENTS
    // with the exact frame size to subtract, so if present, we prefer it and
    // query it first. According to spec, this already includes any borders.
    long xFrameExtent, yFrameExtent;

    if (getEWMHFrameExtents(m_display, m_window, xFrameExtent, yFrameExtent))
    {
        // Get final X/Y coordinates: subtract EWMH frame extents from
        // absolute window position.
        return Vector2i((xAbsRelToRoot - xFrameExtent), (yAbsRelToRoot - yFrameExtent));
    }

    // CASE 3: EWMH frame extents were not available, use geometry.
    // We climb back up to the window before the root and use its
    // geometry information to extract X/Y position. This because
    // re-parenting WMs may re-parent the window multiple times, so
    // we'd have to climb up to the furthest ancestor and sum the
    // relative differences and borders anyway; and doing that to
    // subtract those values from the absolute coordinates of the
    // window is equivalent to going up the tree and asking the
    // furthest ancestor what it's relative distance to the root is.
    // So we use that approach because it's simpler.
    // This approach assumes that any window between the root and
    // our window is part of decorations/borders in some way. This
    // seems to hold true for most reasonable WM implementations.
    ::Window ancestor = m_window;
    ::Window root = DefaultRootWindow(m_display);

    while (getParentWindow(m_display, ancestor) != root)
    {
        // Next window up (parent window).
        ancestor = getParentWindow(m_display, ancestor);
    }

    // Get final X/Y coordinates: take the relative position to
    // the root of the furthest ancestor window.
    int xRelToRoot, yRelToRoot;
    unsigned int width, height, borderWidth, depth;

    XGetGeometry(m_display, ancestor, &root, &xRelToRoot, &yRelToRoot,
        &width, &height, &borderWidth, &depth);

    return Vector2i(xRelToRoot, yRelToRoot);
}